

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_opt_start(lua_State *L)

{
  byte bVar1;
  MSize *pMVar2;
  GCstr *__s1;
  char cVar3;
  bool bVar4;
  int iVar5;
  GCstr *pGVar6;
  int iVar7;
  uint uVar8;
  global_State *g;
  int iVar9;
  char *pcVar10;
  GCstr *__s1_00;
  long lVar11;
  ulong uVar12;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  iVar9 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  if (iVar9 == 0) {
    g[1].strempty.hash = g[1].strempty.hash & 0xf000ffff | 0x3ff0000;
  }
  else {
    iVar7 = 0;
    if (0 < iVar9) {
      iVar7 = iVar9;
    }
    for (iVar9 = 1; iVar9 != iVar7 + 1; iVar9 = iVar9 + 1) {
      pGVar6 = lj_lib_checkstr(L,iVar9);
      cVar3 = (char)pGVar6[1].nextgc.gcptr32;
      if (((byte)(cVar3 - 0x30U) < 10) && (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 1) == '\0'))
      {
        uVar8 = 0x3ff0000;
        if ((byte)(cVar3 - 0x30U) < 3) {
          uVar8 = *(uint *)(&DAT_0014dc4c + (ulong)(byte)(cVar3 - 0x30U) * 4);
        }
        g[1].strempty.hash = g[1].strempty.hash & 0xf000ffff | uVar8;
      }
      else {
        __s1 = pGVar6 + 1;
        if (cVar3 == 'n') {
          if (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 1) == 'o') {
            __s1_00 = (GCstr *)((long)&(__s1->nextgc).gcptr32 +
                               (ulong)(*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 2) == '-') + 2);
            goto LAB_00142833;
          }
LAB_0014283b:
          bVar4 = false;
          __s1_00 = __s1;
        }
        else if (cVar3 == '-') {
          __s1_00 = (GCstr *)((long)&pGVar6[1].nextgc.gcptr32 + 1);
LAB_00142833:
          bVar4 = true;
        }
        else {
          if (cVar3 != '+') goto LAB_0014283b;
          bVar4 = false;
          __s1_00 = (GCstr *)((long)&pGVar6[1].nextgc.gcptr32 + 1);
        }
        uVar8 = 0x10000;
        for (pcVar10 = 
             "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse";
            uVar12 = (ulong)(byte)*pcVar10, uVar12 != 0;
            pcVar10 = (char *)((byte *)pcVar10 + uVar12 + 1)) {
          iVar5 = strncmp((char *)__s1_00,(char *)((byte *)pcVar10 + 1),uVar12);
          if ((iVar5 == 0) && (*(char *)((long)&(__s1_00->nextgc).gcptr32 + uVar12) == '\0')) {
            if (bVar4) {
              pMVar2 = &g[1].strempty.hash;
              *pMVar2 = *pMVar2 & ~uVar8;
            }
            else {
              pMVar2 = &g[1].strempty.hash;
              *pMVar2 = *pMVar2 | uVar8;
            }
            goto LAB_0014296a;
          }
          uVar8 = uVar8 * 2;
        }
        lVar11 = 0x1e4;
        pcVar10 = 
        "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
        ;
        while( true ) {
          if ((int)lVar11 == 0x1f2) goto LAB_00142998;
          uVar12 = (ulong)(byte)*pcVar10;
          iVar5 = strncmp((char *)__s1,(char *)((byte *)pcVar10 + 1),uVar12);
          if ((iVar5 == 0) && (*(char *)((long)&(__s1->nextgc).gcptr32 + uVar12) == '=')) break;
          pcVar10 = (char *)((byte *)pcVar10 + uVar12 + 1);
          lVar11 = lVar11 + 1;
        }
        pcVar10 = (char *)((long)&pGVar6[1].nextgc.gcptr32 + uVar12 + 1);
        iVar5 = 0;
        while( true ) {
          bVar1 = *pcVar10 - 0x30;
          if (9 < bVar1) break;
          iVar5 = (uint)bVar1 + iVar5 * 10;
          pcVar10 = pcVar10 + 1;
        }
        if (*pcVar10 != '\0') {
LAB_00142998:
          lj_err_callerv(L,LJ_ERR_JITOPT,__s1);
        }
        *(int *)((long)&g->strhash + lVar11 * 4) = iVar5;
        if ((int)lVar11 == 0x1e9) {
          lj_dispatch_init_hotcount(g);
        }
      }
LAB_0014296a:
    }
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}